

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

void P_FireWeaponAlt(player_t *player,FState *state)

{
  DBot *pDVar1;
  AWeapon *this;
  bool bVar2;
  FState *pFVar3;
  DPSprite *this_00;
  FName local_1c;
  
  pDVar1 = (player->Bot).field_0.p;
  if (pDVar1 != (DBot *)0x0) {
    if (((pDVar1->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_004390be;
    (player->Bot).field_0.p = (DBot *)0x0;
  }
  if (bot_observer.Value != false) {
    return;
  }
LAB_004390be:
  this = player->ReadyWeapon;
  if (this != (AWeapon *)0x0) {
    local_1c.Index = 0xa6;
    pFVar3 = AActor::FindState((AActor *)this,&local_1c);
    if ((pFVar3 != (FState *)0x0) && (bVar2 = AWeapon::CheckAmmo(this,1,true,false,-1), bVar2)) {
      APlayerPawn::PlayAttacking(player->mo);
      this->bAltFire = true;
      if (state == (FState *)0x0) {
        state = AWeapon::GetAltAtkState(this,player->refire != 0);
      }
      this_00 = player_t::GetPSprite(player,PSP_WEAPON);
      DPSprite::SetState(this_00,state,false);
      if (((this->super_AStateProvider).super_AInventory.field_0x4fc & 0x10) == 0) {
        P_NoiseAlert(&player->mo->super_AActor,&player->mo->super_AActor,false,0.0);
      }
    }
  }
  return;
}

Assistant:

void P_FireWeaponAlt (player_t *player, FState *state)
{
	AWeapon *weapon;

	// [SO] 9/2/02: People were able to do an awful lot of damage
	// when they were observers...
	if (player->Bot == nullptr && bot_observer)
	{
		return;
	}

	weapon = player->ReadyWeapon;
	if (weapon == nullptr || weapon->FindState(NAME_AltFire) == nullptr || !weapon->CheckAmmo (AWeapon::AltFire, true))
	{
		return;
	}

	player->mo->PlayAttacking ();
	weapon->bAltFire = true;

	if (state == nullptr)
	{
		state = weapon->GetAltAtkState(!!player->refire);
	}

	P_SetPsprite(player, PSP_WEAPON, state);
	if (!(weapon->WeaponFlags & WIF_NOALERT))
	{
		P_NoiseAlert (player->mo, player->mo, false);
	}
}